

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::SectionEndInfo::SectionEndInfo
          (SectionEndInfo *this,SectionInfo *_sectionInfo,Counts *_prevAssertions,
          double _durationInSeconds)

{
  pointer pcVar1;
  size_t sVar2;
  
  (this->sectionInfo).name._M_dataplus._M_p = (pointer)&(this->sectionInfo).name.field_2;
  pcVar1 = (_sectionInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (_sectionInfo->name)._M_string_length);
  (this->sectionInfo).description._M_dataplus._M_p =
       (pointer)&(this->sectionInfo).description.field_2;
  pcVar1 = (_sectionInfo->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sectionInfo).description,pcVar1,
             pcVar1 + (_sectionInfo->description)._M_string_length);
  (this->sectionInfo).lineInfo.file._M_dataplus._M_p =
       (pointer)&(this->sectionInfo).lineInfo.file.field_2;
  pcVar1 = (_sectionInfo->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sectionInfo).lineInfo,pcVar1,
             pcVar1 + (_sectionInfo->lineInfo).file._M_string_length);
  (this->sectionInfo).lineInfo.line = (_sectionInfo->lineInfo).line;
  sVar2 = _prevAssertions->failed;
  (this->prevAssertions).passed = _prevAssertions->passed;
  (this->prevAssertions).failed = sVar2;
  (this->prevAssertions).failedButOk = _prevAssertions->failedButOk;
  this->durationInSeconds = _durationInSeconds;
  return;
}

Assistant:

SectionEndInfo( SectionInfo const& _sectionInfo, Counts const& _prevAssertions, double _durationInSeconds )
        : sectionInfo( _sectionInfo ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
        {}